

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

prsndef * prsnew4(prscxdef *ctx,int t,prsndef *n1,prsndef *n2,prsndef *n3,prsndef *n4)

{
  prsndef *ppVar1;
  
  ppVar1 = (prsndef *)prsbalo(ctx,0x28);
  ppVar1->prsntyp = t;
  ppVar1->prsnnlf = 4;
  (ppVar1->prsnv).prsnvn[0] = n1;
  (ppVar1->prsnv).prsnvn[1] = n2;
  (ppVar1->prsnv).prsnvn[2] = n3;
  (ppVar1->prsnv).prsnvn[3] = n4;
  return ppVar1;
}

Assistant:

prsndef *prsnew4(prscxdef *ctx, int t, prsndef *n1, prsndef *n2,
                 prsndef *n3, prsndef *n4)
{
    prsndef *n = prsalo(ctx, 4);
    
    n->prsntyp = t;
    n->prsnnlf = 4;
    n->prsnv.prsnvn[0] = n1;
    n->prsnv.prsnvn[1] = n2;
    n->prsnv.prsnvn[2] = n3;
    n->prsnv.prsnvn[3] = n4;
    return(n);
}